

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_cls_s16_aarch64(uint32_t arg)

{
  int iVar1;
  int iVar2;
  anon_union_4_2_9473010e conv_u_1;
  anon_union_4_2_9473010e conv_u;
  neon_s16 vdest;
  neon_s16 vsrc1;
  uint32_t arg_local;
  
  conv_u.v.v1 = (int16_t)arg;
  if (conv_u.v.v1 < 0) {
    conv_u.v.v1 = conv_u.v.v1 ^ 0xffff;
  }
  iVar1 = do_clz16(conv_u.v.v1);
  conv_u.v.v2 = (int16_t)(arg >> 0x10);
  if ((int)arg < 0) {
    conv_u.v.v2 = conv_u.v.v2 ^ 0xffff;
  }
  iVar2 = do_clz16(conv_u.v.v2);
  conv_u_1.v.v2 = (short)iVar2 + -1;
  conv_u_1.v.v1 = (short)iVar1 + -1;
  return conv_u_1.i;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}